

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void __thiscall QWhatsThat::~QWhatsThat(QWhatsThat *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007fac50;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWhatsThat_007fae00;
  instance = (QWhatsThat *)0x0;
  if (this->doc != (QTextDocument *)0x0) {
    (**(code **)(*(long *)this->doc + 0x20))();
  }
  pDVar1 = (this->anchor).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->anchor).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->text).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->text).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->widget).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->widget).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QWhatsThat::~QWhatsThat()
{
    instance = nullptr;
    if (doc)
        delete doc;
}